

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

sqlite3_value * sqlite3_column_value(sqlite3_stmt *pStmt,int i)

{
  uint uVar1;
  Mem *pMVar2;
  
  pMVar2 = columnMem(pStmt,i);
  uVar1._0_2_ = pMVar2->flags;
  uVar1._2_1_ = pMVar2->enc;
  uVar1._3_1_ = pMVar2->eSubtype;
  if ((uVar1 >> 0xd & 1) != 0) {
    pMVar2->flags = (undefined2)uVar1 & 0x9fff | 0x4000;
  }
  columnMallocFailure(pStmt);
  return pMVar2;
}

Assistant:

SQLITE_API sqlite3_value *sqlite3_column_value(sqlite3_stmt *pStmt, int i){
  Mem *pOut = columnMem(pStmt, i);
  if( pOut->flags&MEM_Static ){
    pOut->flags &= ~MEM_Static;
    pOut->flags |= MEM_Ephem;
  }
  columnMallocFailure(pStmt);
  return (sqlite3_value *)pOut;
}